

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.c
# Opt level: O0

void parse_opts(int argc,char **argv)

{
  int iVar1;
  int c;
  char **argv_local;
  int argc_local;
  
  while (iVar1 = getopt_long(argc,argv,"D:s:d:b:i:o:lHOLC3NR24p:v",parse_opts::lopts,0), iVar1 != -1
        ) {
    switch(iVar1) {
    case 0x32:
      mode = mode | 0x100;
      break;
    case 0x33:
      mode = mode | 0x10;
      break;
    case 0x34:
      mode = mode | 0x200;
      break;
    default:
      print_usage(*argv);
      break;
    case 0x43:
      mode = mode | 4;
      break;
    case 0x44:
      device = _optarg;
      break;
    case 0x48:
      mode = mode | 1;
      break;
    case 0x4c:
      mode = mode | 8;
      break;
    case 0x4e:
      mode = mode | 0x40;
      break;
    case 0x4f:
      mode = mode | 2;
      break;
    case 0x52:
      mode = mode | 0x80;
      break;
    case 0x62:
      iVar1 = atoi(_optarg);
      bits = (uint8_t)iVar1;
      break;
    case 100:
      iVar1 = atoi(_optarg);
      delay = (uint16_t)iVar1;
      break;
    case 0x69:
      input_file = _optarg;
      break;
    case 0x6c:
      mode = mode | 0x20;
      break;
    case 0x6f:
      output_file = _optarg;
      break;
    case 0x70:
      input_tx = _optarg;
      break;
    case 0x73:
      speed = atoi(_optarg);
      break;
    case 0x76:
      verbose = 1;
    }
  }
  if ((mode & 0x20) != 0) {
    if ((mode & 0x100) != 0) {
      mode = mode | 0x400;
    }
    if ((mode & 0x200) != 0) {
      mode = mode | 0x800;
    }
  }
  return;
}

Assistant:

static void parse_opts(int argc, char *argv[])
{
	while (1) {
		static const struct option lopts[] = {
			{ "device",  1, 0, 'D' },
			{ "speed",   1, 0, 's' },
			{ "delay",   1, 0, 'd' },
			{ "bpw",     1, 0, 'b' },
			{ "input",   1, 0, 'i' },
			{ "output",  1, 0, 'o' },
			{ "loop",    0, 0, 'l' },
			{ "cpha",    0, 0, 'H' },
			{ "cpol",    0, 0, 'O' },
			{ "lsb",     0, 0, 'L' },
			{ "cs-high", 0, 0, 'C' },
			{ "3wire",   0, 0, '3' },
			{ "no-cs",   0, 0, 'N' },
			{ "ready",   0, 0, 'R' },
			{ "dual",    0, 0, '2' },
			{ "verbose", 0, 0, 'v' },
			{ "quad",    0, 0, '4' },
			{ NULL, 0, 0, 0 },
		};
		int c;

		c = getopt_long(argc, argv, "D:s:d:b:i:o:lHOLC3NR24p:v",
				lopts, NULL);

		if (c == -1)
			break;

		switch (c) {
		case 'D':
			device = optarg;
			break;
		case 's':
			speed = atoi(optarg);
			break;
		case 'd':
			delay = atoi(optarg);
			break;
		case 'b':
			bits = atoi(optarg);
			break;
		case 'i':
			input_file = optarg;
			break;
		case 'o':
			output_file = optarg;
			break;
		case 'l':
			mode |= SPI_LOOP;
			break;
		case 'H':
			mode |= SPI_CPHA;
			break;
		case 'O':
			mode |= SPI_CPOL;
			break;
		case 'L':
			mode |= SPI_LSB_FIRST;
			break;
		case 'C':
			mode |= SPI_CS_HIGH;
			break;
		case '3':
			mode |= SPI_3WIRE;
			break;
		case 'N':
			mode |= SPI_NO_CS;
			break;
		case 'v':
			verbose = 1;
			break;
		case 'R':
			mode |= SPI_READY;
			break;
		case 'p':
			input_tx = optarg;
			break;
		case '2':
			mode |= SPI_TX_DUAL;
			break;
		case '4':
			mode |= SPI_TX_QUAD;
			break;
		default:
			print_usage(argv[0]);
			break;
		}
	}
	if (mode & SPI_LOOP) {
		if (mode & SPI_TX_DUAL)
			mode |= SPI_RX_DUAL;
		if (mode & SPI_TX_QUAD)
			mode |= SPI_RX_QUAD;
	}
}